

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O2

bool __thiscall OSSLRSA::verifyFinal(OSSLRSA *this,ByteString *signature)

{
  Type TVar1;
  OSSLRSAPublicKey *this_00;
  HashAlgorithm *pHVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  EVP_MD *Hash;
  uchar *puVar7;
  size_t sVar8;
  uchar *puVar9;
  size_t sVar10;
  RSA *pRVar11;
  ulong uVar12;
  ByteString *this_01;
  char *format;
  byte bVar13;
  ByteString plain;
  ByteString digest;
  ByteString secondHash;
  ByteString firstHash;
  
  this_00 = (OSSLRSAPublicKey *)(this->super_AsymmetricAlgorithm).currentPublicKey;
  TVar1 = (this->super_AsymmetricAlgorithm).currentMechanism;
  bVar3 = AsymmetricAlgorithm::verifyFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar3) {
    return false;
  }
  ByteString::ByteString(&firstHash);
  ByteString::ByteString(&secondHash);
  iVar4 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&firstHash);
  pHVar2 = this->pSecondHash;
  if (pHVar2 == (HashAlgorithm *)0x0) {
    bVar13 = 1;
  }
  else {
    iVar5 = (*pHVar2->_vptr_HashAlgorithm[4])(pHVar2,&secondHash);
    bVar13 = (byte)iVar5;
  }
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if (this->pSecondHash != (HashAlgorithm *)0x0) {
    (*this->pSecondHash->_vptr_HashAlgorithm[1])();
    this->pSecondHash = (HashAlgorithm *)0x0;
  }
  if (((byte)iVar4 & bVar13) != 1) {
    bVar3 = false;
    goto LAB_0015a0f0;
  }
  operator+(&digest,&firstHash,&secondHash);
  iVar4 = 0;
  switch(TVar1) {
  case RSA_MD5_PKCS:
    iVar4 = 4;
    break;
  case RSA_SHA1_PKCS:
    iVar4 = 0x40;
    break;
  case RSA_SHA224_PKCS:
    iVar4 = 0x2a3;
    break;
  case RSA_SHA256_PKCS:
    iVar4 = 0x2a0;
    break;
  case RSA_SHA384_PKCS:
    iVar4 = 0x2a1;
    break;
  case RSA_SHA512_PKCS:
    iVar4 = 0x2a2;
    break;
  case RSA_SHA1_PKCS_PSS:
    Hash = EVP_sha1();
    goto LAB_00159fdc;
  case RSA_SHA224_PKCS_PSS:
    Hash = EVP_sha224();
    goto LAB_00159fdc;
  case RSA_SHA256_PKCS_PSS:
    Hash = EVP_sha256();
    goto LAB_00159fdc;
  case RSA_SHA384_PKCS_PSS:
    Hash = EVP_sha384();
    goto LAB_00159fdc;
  case RSA_SHA512_PKCS_PSS:
    Hash = EVP_sha512();
LAB_00159fdc:
    ByteString::ByteString(&plain);
    this_01 = (ByteString *)(**(code **)(*(long *)&this_00->super_RSAPublicKey + 0x40))(this_00);
    sVar8 = ByteString::size(this_01);
    ByteString::resize(&plain,sVar8);
    sVar8 = ByteString::size(signature);
    puVar7 = ByteString::const_byte_str(signature);
    puVar9 = ByteString::operator[](&plain,0);
    pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
    uVar6 = RSA_public_decrypt((int)sVar8,puVar7,puVar9,pRVar11,3);
    if ((int)uVar6 < 0) {
      uVar12 = ERR_get_error();
      format = "RSA public decrypt failed (0x%08X)";
      iVar4 = 0x49b;
LAB_0015a0bf:
      bVar3 = false;
      softHSMLog(3,"verifyFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                 ,iVar4,format,uVar12);
    }
    else {
      ByteString::resize(&plain,(ulong)uVar6);
      pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
      puVar7 = ByteString::operator[](&digest,0);
      puVar9 = ByteString::operator[](&plain,0);
      iVar4 = RSA_verify_PKCS1_PSS(pRVar11,puVar7,Hash,puVar9,(int)this->sLen);
      bVar3 = true;
      if (iVar4 != 1) {
        uVar12 = ERR_get_error();
        format = "RSA PSS verify failed (0x%08X)";
        iVar4 = 0x4a9;
        goto LAB_0015a0bf;
      }
    }
    ByteString::~ByteString(&plain);
    goto LAB_0015a0e6;
  case RSA_SSL:
    iVar4 = 0x72;
  }
  puVar7 = ByteString::operator[](&digest,0);
  sVar8 = ByteString::size(&digest);
  puVar9 = ByteString::const_byte_str(signature);
  sVar10 = ByteString::size(signature);
  pRVar11 = (RSA *)OSSLRSAPublicKey::getOSSLKey(this_00);
  iVar4 = RSA_verify(iVar4,puVar7,(uint)sVar8,puVar9,(uint)sVar10,pRVar11);
  bVar3 = true;
  if (iVar4 != 1) {
    uVar12 = ERR_get_error();
    bVar3 = false;
    softHSMLog(3,"verifyFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x4b1,"RSA verify failed (0x%08X)",uVar12);
  }
LAB_0015a0e6:
  ByteString::~ByteString(&digest);
LAB_0015a0f0:
  ByteString::~ByteString(&secondHash);
  ByteString::~ByteString(&firstHash);
  return bVar3;
}

Assistant:

bool OSSLRSA::verifyFinal(const ByteString& signature)
{
	// Save necessary state before calling super class verifyFinal
	OSSLRSAPublicKey* pk = (OSSLRSAPublicKey*) currentPublicKey;
	AsymMech::Type mechanism = currentMechanism;

	if (!AsymmetricAlgorithm::verifyFinal(signature))
	{
		return false;
	}

	ByteString firstHash, secondHash;

	bool bFirstResult = pCurrentHash->hashFinal(firstHash);
	bool bSecondResult = (pSecondHash != NULL) ? pSecondHash->hashFinal(secondHash) : true;

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (pSecondHash != NULL)
	{
		delete pSecondHash;

		pSecondHash = NULL;
	}

	if (!bFirstResult || !bSecondResult)
	{
		return false;
	}

	ByteString digest = firstHash + secondHash;

	// Determine the signature NID type
	int type = 0;
	bool isPSS = false;
	const EVP_MD* hash = NULL;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			type = NID_md5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			type = NID_sha1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			type = NID_sha224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			type = NID_sha256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			type = NID_sha384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			type = NID_sha512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha1();
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha224();
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha256();
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha384();
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha512();
			break;
		case AsymMech::RSA_SSL:
			type = NID_md5_sha1;
			break;
		default:
			break;
	}

	// Perform the verify operation
	bool rv;

	if (isPSS)
	{
		ByteString plain;
		plain.resize(pk->getN().size());
		int result = RSA_public_decrypt(signature.size(),
						(unsigned char*) signature.const_byte_str(),
						&plain[0],
						pk->getOSSLKey(),
						RSA_NO_PADDING);
		if (result < 0)
		{
			rv = false;
			ERROR_MSG("RSA public decrypt failed (0x%08X)", ERR_get_error());
		}
		else
		{
			plain.resize(result);
			result = RSA_verify_PKCS1_PSS(pk->getOSSLKey(), &digest[0],
						      hash, &plain[0], sLen);
			if (result == 1)
			{
				rv = true;
			}
			else
			{
				rv = false;
				ERROR_MSG("RSA PSS verify failed (0x%08X)", ERR_get_error());
			}
		}
	}
	else
	{
		rv = (RSA_verify(type, &digest[0], digest.size(), (unsigned char*) signature.const_byte_str(), signature.size(), pk->getOSSLKey()) == 1);

		if (!rv) ERROR_MSG("RSA verify failed (0x%08X)", ERR_get_error());
	}

	return rv;
}